

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.hpp
# Opt level: O1

string * CLI::Timer::Simple(string *__return_storage_ptr__,string *title,string *time)

{
  pointer pcVar1;
  long lVar2;
  long *plVar3;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pcVar1 = (title->_M_dataplus)._M_p;
  local_40[0] = local_30;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + title->_M_string_length);
  ::std::__cxx11::string::append((char *)local_40);
  plVar3 = (long *)::std::__cxx11::string::_M_append
                             ((char *)local_40,(ulong)(time->_M_dataplus)._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string Simple(std::string title, std::string time) { return title + ": " + time; }